

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O3

void EDCircles::joinLastTwoArcs(MyArc *arcs,int *noArcs)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double r;
  double yc;
  double xc;
  double circleFitError;
  AngleSet angles;
  double local_2220;
  double local_2218;
  double local_2210;
  double local_2208;
  AngleSet local_2200;
  
  lVar1 = (long)*noArcs;
  if ((((1 < lVar1) && (arcs[lVar1 + -2].segmentNo == arcs[lVar1 + -1].segmentNo)) &&
      (arcs[lVar1 + -2].turn == arcs[lVar1 + -1].turn)) &&
     ((arcs[lVar1 + -2].isEllipse == false && (arcs[lVar1 + -1].isEllipse == false)))) {
    dVar4 = arcs[lVar1 + -2].r;
    dVar5 = arcs[lVar1 + -1].r;
    dVar6 = dVar5;
    if (dVar4 <= dVar5) {
      dVar6 = dVar4;
    }
    if ((ABS(dVar4 - dVar5) <= dVar6 * 0.25) &&
       (dVar4 = (double)(arcs[lVar1 + -2].ex - arcs[lVar1 + -1].sx),
       dVar5 = (double)(arcs[lVar1 + -2].ey - arcs[lVar1 + -1].sy),
       SQRT(dVar4 * dVar4 + dVar5 * dVar5) <= 10.0)) {
      iVar2 = arcs[lVar1 + -1].noPixels + arcs[lVar1 + -2].noPixels;
      CircleFit(arcs[lVar1 + -2].x,arcs[lVar1 + -2].y,iVar2,&local_2210,&local_2218,&local_2220,
                &local_2208);
      if (local_2208 <= 1.5) {
        arcs[lVar1 + -2].noPixels = iVar2;
        arcs[lVar1 + -2].circleFitError = local_2208;
        arcs[lVar1 + -2].xc = local_2210;
        arcs[lVar1 + -2].yc = local_2218;
        arcs[lVar1 + -2].r = local_2220;
        iVar2 = arcs[lVar1 + -1].ey;
        arcs[lVar1 + -2].ex = arcs[lVar1 + -1].ex;
        arcs[lVar1 + -2].ey = iVar2;
        local_2200.head = -1;
        local_2200.next = 0;
        local_2200.overlapAmount = 0.0;
        AngleSet::set(&local_2200,arcs[lVar1 + -2].sTheta,arcs[lVar1 + -2].eTheta);
        AngleSet::set(&local_2200,arcs[lVar1 + -1].sTheta,arcs[lVar1 + -1].eTheta);
        AngleSet::computeStartEndTheta
                  (&local_2200,&arcs[lVar1 + -2].sTheta,&arcs[lVar1 + -2].eTheta);
        dVar4 = arcs[lVar1 + -2].sTheta;
        uVar3 = -(ulong)(dVar4 < arcs[lVar1 + -2].eTheta);
        arcs[lVar1 + -2].coverRatio =
             ((double)(~uVar3 & (ulong)(6.283185307179586 - dVar4) | (ulong)-dVar4 & uVar3) +
             arcs[lVar1 + -2].eTheta) / 6.283185307179586;
        *noArcs = *noArcs + -1;
      }
    }
  }
  return;
}

Assistant:

void EDCircles::joinLastTwoArcs(MyArc *arcs, int &noArcs)
{
	if (noArcs < 2) return;

	int prev = noArcs - 2;
	int last = noArcs - 1;

	if (arcs[prev].segmentNo != arcs[last].segmentNo) return;
	if (arcs[prev].turn != arcs[last].turn) return;
	if (arcs[prev].isEllipse || arcs[last].isEllipse) return;

	// The radius difference between the arcs must be very small
	double minR = MIN(arcs[prev].r, arcs[last].r);
	double radiusDiffThreshold = minR*0.25;

	double diff = fabs(arcs[prev].r - arcs[last].r);
	if (diff > radiusDiffThreshold) return;

	// End-point distance
	double dx = arcs[prev].ex - arcs[last].sx;
	double dy = arcs[prev].ey - arcs[last].sy;
	double d = sqrt(dx*dx + dy*dy);

	double endPointDiffThreshold = 10;
	if (d > endPointDiffThreshold) return;

	// Try join
	int noPixels = arcs[prev].noPixels + arcs[last].noPixels;

	double xc, yc, r, circleFitError;
	CircleFit(arcs[prev].x, arcs[prev].y, noPixels, &xc, &yc, &r, &circleFitError);

	if (circleFitError <= LONG_ARC_ERROR) {
		arcs[prev].noPixels = noPixels;
		arcs[prev].circleFitError = circleFitError;

		arcs[prev].xc = xc;
		arcs[prev].yc = yc;
		arcs[prev].r = r;
		arcs[prev].ex = arcs[last].ex;
		arcs[prev].ey = arcs[last].ey;
		//    arcs[prev].eTheta = arcs[last].eTheta;   -- Fails in a very nasty way in a very special case (recall circles9 with cvsmooth(7x7)!) So, do not use.

		AngleSet angles;
		angles.set(arcs[prev].sTheta, arcs[prev].eTheta);
		angles.set(arcs[last].sTheta, arcs[last].eTheta);
		angles.computeStartEndTheta(arcs[prev].sTheta, arcs[prev].eTheta);

		//    arcs[prev].coverRatio = noPixels/(TWOPI*r);
		arcs[prev].coverRatio = ArcLength(arcs[prev].sTheta, arcs[prev].eTheta) / (TWOPI);

		noArcs--;
	} //end-if
}